

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunnonlinsol_fixedpoint.c
# Opt level: O2

int SUNNonlinSolFree_FixedPoint(SUNNonlinearSolver NLS)

{
  if (NLS != (SUNNonlinearSolver)0x0) {
    if (NLS->content != (void *)0x0) {
      FreeContent(NLS);
      free(NLS->content);
      NLS->content = (void *)0x0;
    }
    free(NLS->ops);
    free(NLS);
  }
  return 0;
}

Assistant:

int SUNNonlinSolFree_FixedPoint(SUNNonlinearSolver NLS)
{
  /* return if NLS is already free */
  if (NLS == NULL)  return(SUN_NLS_SUCCESS);

  /* free items from content structure, then the structure itself */
  if (NLS->content) {
    FreeContent(NLS);
    free(NLS->content);
    NLS->content = NULL;
  }

  /* free the ops structure */
  if (NLS->ops) {
    free(NLS->ops);
    NLS->ops = NULL;
  }

  /* free the overall NLS structure */
  free(NLS);

  return(SUN_NLS_SUCCESS);
}